

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_FeatureExtensionError_Test::
TestBody(CommandLineInterfaceTest_FeatureExtensionError_Test *this)

{
  MockCodeGenerator *pMVar1;
  Descriptor *pDVar2;
  string_view name;
  string_view name_00;
  string_view name_01;
  initializer_list<const_google::protobuf::FieldDescriptor_*> __l;
  string_view expected_substring;
  string_view contents;
  string_view contents_00;
  string_view contents_01;
  allocator_type local_71;
  string local_70;
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_50;
  string local_38;
  
  pDVar2 = DescriptorProto::GetDescriptor();
  FileDescriptor::DebugString_abi_cxx11_(&local_70,pDVar2->file_);
  name._M_str = "google/protobuf/descriptor.proto";
  name._M_len = 0x20;
  contents._M_str = local_70._M_dataplus._M_p;
  contents._M_len = local_70._M_string_length;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name,contents);
  std::__cxx11::string::~string((string *)&local_70);
  pDVar2 = pb::TestInvalidFeatures::GetDescriptor();
  FileDescriptor::DebugString_abi_cxx11_(&local_70,pDVar2->file_);
  name_00._M_str = "features.proto";
  name_00._M_len = 0xe;
  contents_00._M_str = local_70._M_dataplus._M_p;
  contents_00._M_len = local_70._M_string_length;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name_00,contents_00)
  ;
  std::__cxx11::string::~string((string *)&local_70);
  name_01._M_str = "foo.proto";
  name_01._M_len = 9;
  contents_01._M_str =
       "\n    edition = \"2023\";\n    import \"features.proto\";\n    message Foo {\n      int32 bar = 1;\n      int32 baz = 2 [features.(pb.test_invalid).repeated_feature = 5];\n    }"
  ;
  contents_01._M_len = 0xa7;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name_01,contents_01)
  ;
  pMVar1 = (this->super_CommandLineInterfaceTest).mock_generator_;
  local_70._M_dataplus._M_p =
       (pointer)GetExtensionReflection<google::protobuf::FeatureSet,google::protobuf::internal::MessageTypeTraits<pb::TestInvalidFeatures>,(unsigned_char)11,false,google::protobuf::DescriptorPool>
                          ((ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestInvalidFeatures>,_(unsigned_char)__v_,_false>
                            *)pb::test_invalid);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_70;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)&local_50,__l,&local_71);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::operator=(&pMVar1->feature_extensions_,
              (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)&local_50);
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "protocol_compiler --proto_path=$tmpdir --test_out=$tmpdir foo.proto",
             (allocator<char> *)&local_70);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  expected_substring._M_str =
       "Feature field pb.TestInvalidFeatures.repeated_feature is an unsupported repeated field";
  expected_substring._M_len = 0x56;
  CommandLineInterfaceTester::ExpectErrorSubstring
            ((CommandLineInterfaceTester *)this,expected_substring);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, FeatureExtensionError) {
  CreateTempFile("google/protobuf/descriptor.proto",
                 google::protobuf::DescriptorProto::descriptor()->file()->DebugString());
  CreateTempFile("features.proto",
                 pb::TestInvalidFeatures::descriptor()->file()->DebugString());
  CreateTempFile("foo.proto",
                 R"schema(
    edition = "2023";
    import "features.proto";
    message Foo {
      int32 bar = 1;
      int32 baz = 2 [features.(pb.test_invalid).repeated_feature = 5];
    })schema");

  mock_generator_->set_feature_extensions(
      {GetExtensionReflection(pb::test_invalid)});

  Run("protocol_compiler --proto_path=$tmpdir --test_out=$tmpdir foo.proto");
  ExpectErrorSubstring(
      "Feature field pb.TestInvalidFeatures.repeated_feature is an unsupported "
      "repeated field");
}